

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::constrainedfacets(tetgenmesh *this)

{
  ulong uVar1;
  tetrahedron *pppdVar2;
  uint *puVar3;
  uint uVar4;
  tetrahedron *pppdVar5;
  arraypool *paVar6;
  tetgenmesh *ptVar7;
  bool bVar8;
  bool bVar9;
  int i;
  int iVar10;
  interresult iVar11;
  arraypool *crosstets;
  arraypool *newtets;
  arraypool *this_00;
  arraypool *paVar12;
  arraypool *paVar13;
  char *pcVar14;
  char *pcVar15;
  tetrahedron ppdVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  char **ppcVar23;
  int iVar24;
  tetrahedron *pppdVar25;
  ulong uVar26;
  ulong uVar27;
  face *pfVar28;
  face searchsh;
  triface searchtet;
  triface crossedge;
  arraypool *paVar29;
  long local_f8;
  face local_e0;
  arraypool *local_d0;
  arraypool *local_c8;
  ulong local_c0;
  arraypool *local_b8;
  arraypool *local_b0;
  arraypool *local_a8;
  arraypool *local_a0;
  arraypool *local_98;
  char **local_90;
  triface local_88;
  arraypool *local_78;
  arraypool *local_70;
  arraypool *local_68;
  arraypool *local_60;
  ulong local_58;
  tetgenmesh *local_50;
  triface local_48;
  face *local_38;
  
  uVar27 = 0;
  local_88.tet = (tetrahedron *)0x0;
  local_88.ver = 0;
  local_48.tet = (tetrahedron *)0x0;
  local_48.ver = 0;
  local_e0.sh = (shellface *)0x0;
  local_e0.shver = 0;
  crosstets = (arraypool *)operator_new(0x30);
  crosstets->objectbytes = 0x10;
  crosstets->objectsperblock = 0x400;
  crosstets->log2objectsperblock = 10;
  crosstets->objectsperblockmark = 0x3ff;
  crosstets->toparraylen = 0;
  crosstets->toparray = (char **)0x0;
  crosstets->objects = 0;
  crosstets->totalmemory = 0;
  local_70 = (arraypool *)operator_new(0x30);
  local_70->objectbytes = 0x10;
  local_70->objectsperblock = 0x400;
  local_70->log2objectsperblock = 10;
  local_70->objectsperblockmark = 0x3ff;
  local_70->toparraylen = 0;
  local_70->toparray = (char **)0x0;
  local_70->objects = 0;
  local_70->totalmemory = 0;
  newtets = (arraypool *)operator_new(0x30);
  newtets->objectbytes = 0x10;
  newtets->objectsperblock = 0x400;
  newtets->log2objectsperblock = 10;
  newtets->objectsperblockmark = 0x3ff;
  newtets->toparraylen = 0;
  newtets->toparray = (char **)0x0;
  newtets->objects = 0;
  newtets->totalmemory = 0;
  local_a8 = (arraypool *)operator_new(0x30);
  local_a8->objectbytes = 0x10;
  local_a8->objectsperblock = 0x400;
  local_a8->log2objectsperblock = 10;
  local_a8->objectsperblockmark = 0x3ff;
  local_a8->toparraylen = 0;
  local_a8->toparray = (char **)0x0;
  local_a8->objects = 0;
  local_a8->totalmemory = 0;
  local_68 = (arraypool *)operator_new(0x30);
  local_68->objectbytes = 0x10;
  local_68->objectsperblock = 0x400;
  local_68->log2objectsperblock = 10;
  local_68->objectsperblockmark = 0x3ff;
  local_68->toparraylen = 0;
  local_68->toparray = (char **)0x0;
  local_68->objects = 0;
  local_68->totalmemory = 0;
  local_78 = (arraypool *)operator_new(0x30);
  local_78->objectbytes = 0x10;
  local_78->objectsperblock = 0x400;
  local_78->log2objectsperblock = 10;
  local_78->objectsperblockmark = 0x3ff;
  local_78->toparraylen = 0;
  local_78->toparray = (char **)0x0;
  local_78->objects = 0;
  local_78->totalmemory = 0;
  local_d0 = (arraypool *)operator_new(0x30);
  local_d0->objectbytes = 8;
  local_d0->objectsperblock = 0x100;
  local_d0->log2objectsperblock = 8;
  local_d0->objectsperblockmark = 0xff;
  local_d0->toparraylen = 0;
  local_d0->toparray = (char **)0x0;
  local_d0->objects = 0;
  local_d0->totalmemory = 0;
  local_b0 = (arraypool *)operator_new(0x30);
  local_b0->objectbytes = 8;
  local_b0->objectsperblock = 0x100;
  local_b0->log2objectsperblock = 8;
  local_b0->objectsperblockmark = 0xff;
  local_b0->toparraylen = 0;
  local_b0->toparray = (char **)0x0;
  local_b0->objects = 0;
  local_b0->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x10;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  local_a0 = (arraypool *)operator_new(0x30);
  local_a0->objectbytes = 0x10;
  local_a0->objectsperblock = 0x400;
  local_a0->log2objectsperblock = 10;
  local_a0->objectsperblockmark = 0x3ff;
  local_a0->toparraylen = 0;
  local_a0->toparray = (char **)0x0;
  local_a0->objects = 0;
  local_a0->totalmemory = 0;
  local_60 = (arraypool *)operator_new(0x30);
  local_60->objectbytes = 0x10;
  local_60->objectsperblock = 0x400;
  local_60->log2objectsperblock = 10;
  local_60->objectsperblockmark = 0x3ff;
  local_60->toparraylen = 0;
  local_60->toparray = (char **)0x0;
  local_60->objects = 0;
  local_60->totalmemory = 0;
  paVar12 = (arraypool *)operator_new(0x30);
  paVar12->objectbytes = 0x10;
  paVar12->objectsperblock = 0x400;
  paVar12->log2objectsperblock = 10;
  paVar12->objectsperblockmark = 0x3ff;
  paVar12->toparraylen = 0;
  paVar12->toparray = (char **)0x0;
  paVar12->objects = 0;
  paVar12->totalmemory = 0;
  local_98 = (arraypool *)operator_new(0x30);
  local_98->objectbytes = 0x10;
  local_98->objectsperblock = 0x400;
  local_98->log2objectsperblock = 10;
  local_98->objectsperblockmark = 0x3ff;
  local_98->toparraylen = 0;
  local_98->toparray = (char **)0x0;
  local_98->objects = 0;
  local_98->totalmemory = 0;
  local_c8 = (arraypool *)operator_new(0x30);
  local_c8->objectbytes = 8;
  local_c8->objectsperblock = 0x100;
  local_c8->log2objectsperblock = 8;
  local_c8->objectsperblockmark = 0xff;
  local_c8->toparraylen = 0;
  local_c8->toparray = (char **)0x0;
  local_c8->objects = 0;
  local_c8->totalmemory = 0;
  paVar13 = (arraypool *)operator_new(0x30);
  paVar13->objectbytes = 0x10;
  paVar13->objectsperblock = 0x10;
  paVar13->log2objectsperblock = 4;
  paVar13->objectsperblockmark = 0xf;
  paVar13->toparraylen = 0;
  paVar13->toparray = (char **)0x0;
  paVar13->objects = 0;
  paVar13->totalmemory = 0;
  this->encseglist = paVar13;
  paVar13 = this->subfacstack;
  uVar22 = paVar13->objects;
  local_b8 = paVar12;
  if (0 < (long)uVar22) {
    local_38 = &this->recentsh;
    uVar26 = 0;
    do {
      while( true ) {
        uVar1 = uVar22 - 1;
        lVar19 = (uVar1 & (long)paVar13->objectsperblockmark) * (long)paVar13->objectbytes;
        local_e0.sh = *(shellface **)
                       (paVar13->toparray[uVar1 >> ((byte)paVar13->log2objectsperblock & 0x3f)] +
                       lVar19);
        local_e0.shver =
             *(int *)(paVar13->toparray[uVar1 >> ((byte)paVar13->log2objectsperblock & 0x3f)] +
                     lVar19 + 8);
        if ((local_e0.sh[3] != (shellface)0x0) &&
           (local_e0.sh[(ulong)(local_e0.shver & 1) + 9] == (shellface)0x0)) break;
        bVar9 = uVar22 < 2;
        uVar22 = uVar1;
        if (bVar9) {
          paVar13->objects = uVar1;
          goto LAB_00133b22;
        }
      }
      paVar13->objects = uVar22 - 1;
      puVar3 = (uint *)((long)local_e0.sh + (long)this->shmarkindex * 4 + 4);
      *puVar3 = *puVar3 | 2;
      pcVar14 = arraypool::getblock(this_00,(int)uVar26);
      uVar22 = this_00->objects;
      local_f8 = (long)this_00->objectbytes;
      lVar19 = ((long)this_00->objectsperblock - 1U & uVar22) * local_f8;
      uVar26 = uVar22 + 1;
      this_00->objects = uVar26;
      *(shellface **)(pcVar14 + lVar19) = local_e0.sh;
      *(int *)(pcVar14 + lVar19 + 8) = local_e0.shver;
      if ((long)uVar22 < 0) {
        bVar9 = false;
      }
      else {
        lVar19 = 0;
        local_c0 = uVar27;
        do {
          pcVar14 = this_00->toparray[(uint)lVar19 >> ((byte)this_00->log2objectsperblock & 0x1f)];
          lVar20 = (long)(int)((this_00->objectsperblockmark & (uint)lVar19) * (int)local_f8);
          iVar10 = *(int *)(pcVar14 + lVar20 + 8);
          iVar24 = 3;
          do {
            if (*(long *)(*(long *)(pcVar14 + lVar20) + 0x30 + (long)(iVar10 >> 1) * 8) == 0) {
              uVar22 = *(ulong *)(*(long *)(pcVar14 + lVar20) + (long)(iVar10 >> 1) * 8);
              uVar17 = (uint)uVar22;
              local_e0.shver = uVar17 & 7;
              local_e0.sh = (shellface *)(uVar22 & 0xfffffffffffffff8);
              uVar4 = *(uint *)((long)local_e0.sh + (long)this->shmarkindex * 4 + 4);
              if (((uVar4 & 2) == 0) && (local_e0.sh[(ulong)(uVar17 & 1) + 9] == (shellface)0x0)) {
                *(uint *)((long)local_e0.sh + (long)this->shmarkindex * 4 + 4) = uVar4 | 2;
                pcVar15 = arraypool::getblock(this_00,(int)uVar26);
                local_f8 = (long)this_00->objectbytes;
                lVar18 = ((long)this_00->objectsperblock - 1U & this_00->objects) * local_f8;
                uVar26 = this_00->objects + 1;
                this_00->objects = uVar26;
                *(shellface **)(pcVar15 + lVar18) = local_e0.sh;
                *(int *)(pcVar15 + lVar18 + 8) = local_e0.shver;
              }
            }
            iVar10 = snextpivot[*(int *)(pcVar14 + lVar20 + 8)];
            *(int *)(pcVar14 + lVar20 + 8) = iVar10;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (long)uVar26);
        bVar9 = 0 < (long)uVar26;
        uVar27 = local_c0;
        if ((long)uVar26 < 1) {
          bVar9 = false;
        }
        else {
          ppcVar23 = this_00->toparray;
          iVar10 = this_00->log2objectsperblock;
          uVar4 = this_00->objectsperblockmark;
          uVar22 = 0;
          do {
            puVar3 = (uint *)(*(long *)(ppcVar23[(uint)uVar22 >> ((byte)iVar10 & 0x1f)] +
                                       (int)((uVar4 & (uint)uVar22) * (int)local_f8)) + 4 +
                             (long)this->shmarkindex * 4);
            *puVar3 = *puVar3 & 0xfffffffd;
            uVar22 = uVar22 + 1;
          } while (uVar26 != uVar22);
        }
      }
      uVar27 = (ulong)((int)uVar27 + 1);
      if (1 < this->b->verbose) {
        printf("    Recovering facet #%d: %ld subfaces.\n",uVar27,uVar26);
      }
      uVar22 = uVar27;
      ptVar7 = this;
      if (bVar9) {
        do {
          local_50 = ptVar7;
          local_c0 = uVar22;
          uVar26 = uVar26 - 1;
          this_00->objects = uVar26;
          lVar19 = (long)(int)local_f8 * ((long)this_00->objectsperblockmark & uVar26);
          local_e0.sh = *(shellface **)
                         (this_00->toparray[uVar26 >> ((byte)this_00->log2objectsperblock & 0x3f)] +
                         lVar19);
          local_e0.shver =
               *(int *)(this_00->toparray[uVar26 >> ((byte)this_00->log2objectsperblock & 0x3f)] +
                       lVar19 + 8);
          if ((local_e0.sh[3] != (shellface)0x0) &&
             (local_e0.sh[(ulong)(local_e0.shver & 1) + 9] == (shellface)0x0)) {
            local_88.tet = (tetrahedron *)0x0;
            iVar10 = scoutsubface(this,&local_e0,&local_88,1);
            paVar12 = local_98;
            paVar13 = local_b8;
            if (iVar10 == 0) {
              formregion(this,&local_e0,local_b8,local_98,local_c8);
              iVar10 = scoutcrossedge(this,&local_88,paVar12,paVar13);
              if (iVar10 == 0) {
                lVar19 = paVar13->objects;
                if (0 < lVar19) {
                  local_90 = paVar13->toparray;
                  iVar10 = paVar13->log2objectsperblock;
                  local_58 = (ulong)paVar13->objectsperblockmark;
                  iVar24 = paVar13->objectbytes;
                  lVar20 = 0;
                  do {
                    pcVar14 = local_90[(uint)lVar20 >> ((byte)iVar10 & 0x1f)];
                    lVar21 = ((long)(int)(uint)lVar20 & local_58) * (long)iVar24;
                    pcVar15 = arraypool::getblock(this_00,(int)uVar26);
                    local_f8 = (long)this_00->objectbytes;
                    lVar18 = ((long)this_00->objectsperblock - 1U & this_00->objects) * local_f8;
                    uVar26 = this_00->objects + 1;
                    this_00->objects = uVar26;
                    *(undefined8 *)(pcVar15 + lVar18) = *(undefined8 *)(pcVar14 + lVar21);
                    *(undefined4 *)(pcVar15 + lVar18 + 8) = *(undefined4 *)(pcVar14 + lVar21 + 8);
                    lVar20 = lVar20 + 1;
                    this = local_50;
                  } while (lVar20 < lVar19);
                  goto LAB_001339ff;
                }
                bVar9 = false;
              }
              else {
                local_48.tet = local_88.tet;
                local_48.ver = local_88.ver;
                paVar29 = local_d0;
                bVar8 = formcavity(this,&local_88,paVar13,crosstets,local_a8,local_68,local_d0,
                                   local_b0);
                paVar12 = local_78;
                bVar9 = true;
                if (bVar8) {
                  if (this->b->flipinsert == 0) {
                    delaunizecavity(this,local_d0,local_a8,local_a0,local_70,crosstets,local_78);
                    paVar6 = local_60;
                    delaunizecavity(this,local_b0,local_68,local_60,newtets,crosstets,paVar12);
                    paVar12 = local_70;
                    paVar13 = local_b8;
                    paVar29 = newtets;
                    bVar9 = fillcavity(this,local_a0,paVar6,local_78,local_b8,local_70,newtets,
                                       &local_48);
                    if (!bVar9) {
                      restorecavity(this,crosstets,paVar12,newtets,local_98);
                      uVar27 = local_c0;
                      bVar9 = true;
                      goto LAB_00133a09;
                    }
                    carvecavity(this,crosstets,paVar12,newtets);
                  }
                  else {
                    flipinsertfacet(this,crosstets,local_d0,local_b0,local_c8);
                    lVar19 = paVar13->objects;
                    if (0 < lVar19) {
                      local_90 = paVar13->toparray;
                      iVar10 = paVar13->log2objectsperblock;
                      local_58 = (ulong)paVar13->objectsperblockmark;
                      iVar24 = paVar13->objectbytes;
                      lVar20 = 0;
                      do {
                        pcVar14 = local_90[(uint)lVar20 >> ((byte)iVar10 & 0x1f)];
                        lVar21 = ((long)(int)(uint)lVar20 & local_58) * (long)iVar24;
                        pcVar15 = arraypool::getblock(this_00,(int)uVar26);
                        local_f8 = (long)this_00->objectbytes;
                        lVar18 = ((long)this_00->objectsperblock - 1U & this_00->objects) * local_f8
                        ;
                        uVar26 = this_00->objects + 1;
                        this_00->objects = uVar26;
                        *(undefined8 *)(pcVar15 + lVar18) = *(undefined8 *)(pcVar14 + lVar21);
                        *(undefined4 *)(pcVar15 + lVar18 + 8) =
                             *(undefined4 *)(pcVar14 + lVar21 + 8);
                        lVar20 = lVar20 + 1;
                        this = local_50;
                      } while (lVar20 < lVar19);
                    }
                    crosstets->objects = 0;
                    local_a8->objects = 0;
                    local_68->objects = 0;
                    local_d0->objects = 0;
                    local_b0->objects = 0;
                  }
                  paVar13 = this->caveencshlist;
                  if (0 < paVar13->objects) {
                    lVar19 = 0;
                    do {
                      pfVar28 = (face *)(paVar13->toparray
                                         [(uint)lVar19 >>
                                          ((byte)paVar13->log2objectsperblock & 0x1f)] +
                                        (long)paVar13->objectbytes *
                                        (long)(int)(paVar13->objectsperblockmark & (uint)lVar19));
                      iVar10 = scoutsubface(this,pfVar28,&local_88,1);
                      if (iVar10 == 0) {
                        pcVar14 = arraypool::getblock(this_00,(int)uVar26);
                        local_f8 = (long)this_00->objectbytes;
                        lVar20 = ((long)this_00->objectsperblock - 1U & this_00->objects) * local_f8
                        ;
                        uVar26 = this_00->objects + 1;
                        this_00->objects = uVar26;
                        *(shellface **)(pcVar14 + lVar20) = pfVar28->sh;
                        *(int *)(pcVar14 + lVar20 + 8) = pfVar28->shver;
                      }
                      lVar19 = lVar19 + 1;
                      paVar13 = this->caveencshlist;
                    } while (lVar19 < paVar13->objects);
                  }
                  paVar13->objects = 0;
                  paVar13 = this->caveencseglist;
                  if (0 < paVar13->objects) {
                    ppcVar23 = (char **)0x0;
                    do {
                      pcVar14 = paVar13->toparray
                                [(uint)ppcVar23 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
                      lVar19 = (long)paVar13->objectbytes *
                               (long)(int)(paVar13->objectsperblockmark & (uint)ppcVar23);
                      pfVar28 = (face *)(pcVar14 + lVar19);
                      local_90 = ppcVar23;
                      iVar11 = scoutsegment(this,*(point *)(*(long *)(pcVar14 + lVar19) +
                                                           (long)sorgpivot[*(int *)(pcVar14 +
                                                                                   lVar19 + 8)] * 8)
                                            ,*(point *)(*(long *)(pcVar14 + lVar19) +
                                                       (long)sdestpivot
                                                             [*(int *)(pcVar14 + lVar19 + 8)] * 8),
                                            pfVar28,&local_88,(point *)0x0,paVar29);
                      pppdVar5 = local_88.tet;
                      if (iVar11 != SHAREEDGE) {
                        puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
                        puts("  the message above, your input data set, and the exact");
                        puts("  command line you used to run this program, thank you.");
                        exit(2);
                      }
                      uVar22 = (ulong)local_88.ver;
                      pfVar28->sh[9] = (shellface)(uVar22 | (ulong)local_88.tet);
                      pppdVar25 = local_88.tet;
                      do {
                        ppdVar16 = pppdVar25[8];
                        if (ppdVar16 == (tetrahedron)0x0) {
                          ppdVar16 = (tetrahedron)memorypool::alloc(this->tet2segpool);
                          pppdVar25[8] = ppdVar16;
                          lVar19 = 0;
                          do {
                            pppdVar25[8][lVar19] = (double *)0x0;
                            lVar19 = lVar19 + 1;
                          } while (lVar19 != 6);
                          ppdVar16 = pppdVar25[8];
                        }
                        iVar10 = (int)uVar22;
                        ppdVar16[ver2edge[iVar10]] =
                             (double *)((long)pfVar28->shver | (ulong)pfVar28->sh);
                        pppdVar2 = pppdVar25 + facepivot1[iVar10];
                        pppdVar25 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
                        uVar22 = (ulong)(uint)facepivot2[iVar10][(uint)*pppdVar2 & 0xf];
                      } while (pppdVar5 != pppdVar25);
                      ppcVar23 = (char **)((long)local_90 + 1);
                      paVar13 = this->caveencseglist;
                    } while ((long)ppcVar23 < paVar13->objects);
                  }
                  paVar13->objects = 0;
LAB_001339ff:
                  paVar13 = local_b8;
                  uVar27 = local_c0;
                  bVar9 = false;
                }
              }
LAB_00133a09:
              lVar19 = local_c8->objects;
              if (0 < lVar19) {
                ppcVar23 = local_c8->toparray;
                iVar10 = local_c8->log2objectsperblock;
                uVar4 = local_c8->objectsperblockmark;
                iVar24 = local_c8->objectbytes;
                lVar20 = 0;
                do {
                  puVar3 = (uint *)(*(long *)(ppcVar23[(uint)lVar20 >> ((byte)iVar10 & 0x1f)] +
                                             (long)(int)((uint)lVar20 & uVar4) * (long)iVar24) + 4 +
                                   (long)this->pointmarkindex * 4);
                  *puVar3 = *puVar3 & 0xfffffffd;
                  lVar20 = lVar20 + 1;
                } while (lVar19 != lVar20);
              }
              local_c8->objects = 0;
              local_98->objects = 0;
              paVar13->objects = 0;
              if (bVar9) {
                refineregion(this,local_38,local_d0,local_a8,local_a0,local_70,crosstets,local_78);
              }
            }
          }
          uVar22 = local_c0;
          ptVar7 = local_50;
        } while (0 < (long)uVar26);
      }
      paVar13 = this->subfacstack;
      uVar22 = paVar13->objects;
    } while (0 < (long)uVar22);
  }
LAB_00133b22:
  paVar6 = local_68;
  paVar29 = local_70;
  paVar12 = local_78;
  paVar13 = local_a8;
  this->totalworkmemory =
       this->totalworkmemory +
       local_70->totalmemory + crosstets->totalmemory + newtets->totalmemory + local_a8->totalmemory
       + local_68->totalmemory + local_78->totalmemory + local_d0->totalmemory +
       local_b0->totalmemory + this_00->totalmemory + local_a0->totalmemory + local_60->totalmemory
       + local_b8->totalmemory + local_98->totalmemory + local_c8->totalmemory +
       this->encseglist->totalmemory;
  arraypool::~arraypool(crosstets);
  operator_delete(crosstets,0x30);
  arraypool::~arraypool(paVar29);
  operator_delete(paVar29,0x30);
  arraypool::~arraypool(newtets);
  operator_delete(newtets,0x30);
  arraypool::~arraypool(paVar13);
  operator_delete(paVar13,0x30);
  arraypool::~arraypool(paVar6);
  operator_delete(paVar6,0x30);
  arraypool::~arraypool(paVar12);
  operator_delete(paVar12,0x30);
  paVar13 = local_d0;
  arraypool::~arraypool(local_d0);
  operator_delete(paVar13,0x30);
  paVar13 = local_b0;
  arraypool::~arraypool(local_b0);
  operator_delete(paVar13,0x30);
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  paVar13 = local_a0;
  arraypool::~arraypool(local_a0);
  operator_delete(paVar13,0x30);
  paVar13 = local_60;
  arraypool::~arraypool(local_60);
  operator_delete(paVar13,0x30);
  paVar13 = local_b8;
  arraypool::~arraypool(local_b8);
  operator_delete(paVar13,0x30);
  paVar13 = local_98;
  arraypool::~arraypool(local_98);
  operator_delete(paVar13,0x30);
  paVar13 = local_c8;
  arraypool::~arraypool(local_c8);
  operator_delete(paVar13,0x30);
  paVar13 = this->encseglist;
  if (paVar13 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar13);
  }
  operator_delete(paVar13,0x30);
  this->encseglist = (arraypool *)0x0;
  return;
}

Assistant:

void tetgenmesh::constrainedfacets()
{
  arraypool *tg_crosstets, *tg_topnewtets, *tg_botnewtets;
  arraypool *tg_topfaces, *tg_botfaces, *tg_midfaces;
  arraypool *tg_topshells, *tg_botshells, *tg_facfaces; 
  arraypool *tg_toppoints, *tg_botpoints;
  arraypool *tg_missingshs, *tg_missingshbds, *tg_missingshverts;
  triface searchtet, neightet, crossedge;
  face searchsh, *parysh, *parysh1;
  face *paryseg;
  point *parypt;
  enum interresult dir;
  int facetcount;
  int success;
  int t1ver;
  int i, j;

  // Initialize arrays.
  tg_crosstets      = new arraypool(sizeof(triface), 10);
  tg_topnewtets     = new arraypool(sizeof(triface), 10);
  tg_botnewtets     = new arraypool(sizeof(triface), 10);
  tg_topfaces       = new arraypool(sizeof(triface), 10);
  tg_botfaces       = new arraypool(sizeof(triface), 10);
  tg_midfaces       = new arraypool(sizeof(triface), 10);
  tg_toppoints      = new arraypool(sizeof(point), 8);
  tg_botpoints      = new arraypool(sizeof(point), 8);
  tg_facfaces       = new arraypool(sizeof(face), 10);
  tg_topshells      = new arraypool(sizeof(face), 10);
  tg_botshells      = new arraypool(sizeof(face), 10);
  tg_missingshs     = new arraypool(sizeof(face), 10);
  tg_missingshbds   = new arraypool(sizeof(face), 10);
  tg_missingshverts = new arraypool(sizeof(point), 8);
  // This is a global array used by refineregion().
  encseglist        = new arraypool(sizeof(face), 4);

  facetcount = 0;

  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // It is dead.
    if (isshtet(searchsh)) continue; // It is recovered.

    // Collect all unrecovered subfaces which are co-facet.
    smarktest(searchsh);
    tg_facfaces->newindex((void **) &parysh);
    *parysh = searchsh;
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      for (j = 0; j < 3; j++) {
        if (!isshsubseg(*parysh)) {
          spivot(*parysh, searchsh);
          if (!smarktested(searchsh)) {
            if (!isshtet(searchsh)) {
              smarktest(searchsh);
              tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = searchsh;
            }
          }
        }
        senextself(*parysh);
      } // j
    } // i
    // Have found all facet subfaces. Unmark them.
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      sunmarktest(*parysh);
    }

    if (b->verbose > 1) {
      printf("    Recovering facet #%d: %ld subfaces.\n", facetcount + 1, 
             tg_facfaces->objects);
    }
    facetcount++;

    while (tg_facfaces->objects > 0l) {

      tg_facfaces->objects--;
      parysh = (face *) fastlookup(tg_facfaces, tg_facfaces->objects);
      searchsh = *parysh;

      if (searchsh.sh[3] == NULL) continue; // It is dead.
      if (isshtet(searchsh)) continue; // It is recovered.

      searchtet.tet = NULL;
      if (scoutsubface(&searchsh, &searchtet, 1)) continue;

      // The subface is missing. Form the missing region.
      //   Re-use 'tg_crosstets' for 'adjtets'.
      formregion(&searchsh, tg_missingshs, tg_missingshbds, tg_missingshverts);

      if (scoutcrossedge(searchtet, tg_missingshbds, tg_missingshs)) {
        // Save this crossing edge, will be used by fillcavity().
        crossedge = searchtet;
        // Form a cavity of crossing tets.
        success = formcavity(&searchtet, tg_missingshs, tg_crosstets,
                             tg_topfaces, tg_botfaces, tg_toppoints,
                             tg_botpoints);
        if (success) {
          if (!b->flipinsert) {
            // Tetrahedralize the top part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_toppoints, tg_topfaces, tg_topshells,
                            tg_topnewtets, tg_crosstets, tg_midfaces);
            // Tetrahedralize the bottom part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_botpoints, tg_botfaces, tg_botshells,
                            tg_botnewtets, tg_crosstets, tg_midfaces);
            // Fill the cavity with new tets.
            success = fillcavity(tg_topshells, tg_botshells, tg_midfaces,
                                 tg_missingshs, tg_topnewtets, tg_botnewtets,
                                 &crossedge);
            if (success) {
              // Cavity is remeshed. Delete old tets and outer new tets.
              carvecavity(tg_crosstets, tg_topnewtets, tg_botnewtets);
            } else {
              restorecavity(tg_crosstets, tg_topnewtets, tg_botnewtets,
                            tg_missingshbds);
            }
          } else {
            // Use the flip algorithm of Shewchuk to recover the subfaces.
            flipinsertfacet(tg_crosstets, tg_toppoints, tg_botpoints, 
                            tg_missingshverts);
			// Put all subfaces in R back to tg_facfaces.
		    for (i = 0; i < tg_missingshs->objects; i++) {
		      parysh = (face *) fastlookup(tg_missingshs, i);
		      tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = *parysh;
		    }
			success = 1;
            // Clear working lists.
            tg_crosstets->restart();
            tg_topfaces->restart();
            tg_botfaces->restart();
            tg_toppoints->restart();
            tg_botpoints->restart();
          } // b->flipinsert

          if (success) {
            // Recover interior subfaces.
            for (i = 0; i < caveencshlist->objects; i++) {
              parysh = (face *) fastlookup(caveencshlist, i);
              if (!scoutsubface(parysh, &searchtet, 1)) {
                // Add this face at the end of the list, so it will be
                //   processed immediately.
                tg_facfaces->newindex((void **) &parysh1);
                *parysh1 = *parysh;
              }
            }
            caveencshlist->restart();
            // Recover interior segments. This should always be recovered.
            for (i = 0; i < caveencseglist->objects; i++) {
              paryseg = (face *) fastlookup(caveencseglist, i);
              dir = scoutsegment(sorg(*paryseg), sdest(*paryseg), paryseg,
                                 &searchtet, NULL, NULL);
              if (dir != SHAREEDGE) {
                terminatetetgen(this, 2);
              }
              // Insert this segment.
              // Let the segment remember an adjacent tet.
              sstbond1(*paryseg, searchtet);
              // Bond the segment to all tets containing it.
              neightet = searchtet;
              do {
                tssbond1(neightet, *paryseg);
                fnextself(neightet);
              } while (neightet.tet != searchtet.tet);
            }
            caveencseglist->restart();
          } // success - remesh cavity
        } // success - form cavity
      } else {
        // Put all subfaces in R back to tg_facfaces.
		for (i = 0; i < tg_missingshs->objects; i++) {
		  parysh = (face *) fastlookup(tg_missingshs, i);
		  tg_facfaces->newindex((void **) &parysh1);
          *parysh1 = *parysh;
		}
		success = 1;
      } // if (scoutcrossedge)

      // Unmarktest all points of the missing region.
      for (i = 0; i < tg_missingshverts->objects; i++) {
        parypt = (point *) fastlookup(tg_missingshverts, i);
        punmarktest(*parypt);
      }
      tg_missingshverts->restart();
      tg_missingshbds->restart();
      tg_missingshs->restart();

      if (!success) {
        // The missing region can not be recovered. Refine it.
        refineregion(recentsh, tg_toppoints, tg_topfaces, tg_topshells,
                     tg_topnewtets, tg_crosstets, tg_midfaces);
      }
    } // while (tg_facfaces->objects)

  } // while ((subfacstack->objects)

  // Accumulate the dynamic memory.
  totalworkmemory += (tg_crosstets->totalmemory + tg_topnewtets->totalmemory +
                      tg_botnewtets->totalmemory + tg_topfaces->totalmemory +
                      tg_botfaces->totalmemory + tg_midfaces->totalmemory +
                      tg_toppoints->totalmemory + tg_botpoints->totalmemory +
                      tg_facfaces->totalmemory + tg_topshells->totalmemory +
                      tg_botshells->totalmemory + tg_missingshs->totalmemory +
                      tg_missingshbds->totalmemory + 
                      tg_missingshverts->totalmemory + 
                      encseglist->totalmemory);

  // Delete arrays.
  delete tg_crosstets;
  delete tg_topnewtets;
  delete tg_botnewtets;
  delete tg_topfaces;
  delete tg_botfaces;
  delete tg_midfaces;
  delete tg_toppoints;
  delete tg_botpoints;
  delete tg_facfaces;
  delete tg_topshells;
  delete tg_botshells;
  delete tg_missingshs;
  delete tg_missingshbds;
  delete tg_missingshverts;
  delete encseglist;
  encseglist = NULL;
}